

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tictactoe.cpp
# Opt level: O2

string * __thiscall Game::CurrentPlayerName_abi_cxx11_(string *__return_storage_ptr__,Game *this)

{
  Player PVar1;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  PVar1 = this->m_currentPlayer;
  if (PVar1 == Circle) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Circle",&local_a);
  }
  else if (PVar1 == Cross) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Cross",&local_9);
  }
  else {
    if (PVar1 == None) {
      __assert_fail("m_currentPlayer != Player::None",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/AntoineJT[P]cpp-things/tictactoe.cpp"
                    ,0x8b,"std::string Game::CurrentPlayerName() const");
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Invalid",&local_b);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CurrentPlayerName() const noexcept {
            assert(m_currentPlayer != Player::None);

            switch (m_currentPlayer) {
                case Player::Cross: return "Cross";
                case Player::Circle: return "Circle";
                case Player::None:
                default:
                    return "Invalid";
            }
        }